

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O0

ssl_open_record_t bssl::ssl_process_alert(SSL *ssl,uint8_t *out_alert,Span<const_unsigned_char> in)

{
  uchar uVar1;
  byte bVar2;
  bool bVar3;
  uint16_t uVar4;
  size_t sVar5;
  uchar *puVar6;
  byte *pbVar7;
  size_t in_R9;
  Span<const_unsigned_char> in_00;
  undefined2 local_42;
  uint16_t alert;
  uint8_t alert_descr;
  uint8_t alert_level;
  uint8_t *out_alert_local;
  SSL *ssl_local;
  Span<const_unsigned_char> in_local;
  
  in_local.data_ = (uchar *)in.size_;
  ssl_local = (SSL *)in.data_;
  sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
  if (sVar5 == 2) {
    in_00.size_ = in_R9;
    in_00.data_ = in_local.data_;
    ssl_do_msg_callback((bssl *)ssl,(SSL *)0x0,0x15,(int)ssl_local,in_00);
    puVar6 = Span<const_unsigned_char>::operator[]((Span<const_unsigned_char> *)&ssl_local,0);
    uVar1 = *puVar6;
    pbVar7 = Span<const_unsigned_char>::operator[]((Span<const_unsigned_char> *)&ssl_local,1);
    bVar2 = *pbVar7;
    local_42 = CONCAT11(uVar1,bVar2);
    ssl_do_info_callback(ssl,0x4004,(uint)local_42);
    if (uVar1 == '\x01') {
      if (bVar2 == 0) {
        ssl->s3->read_shutdown = ssl_shutdown_close_notify;
        in_local.size_._4_4_ = ssl_open_record_close_notify;
      }
      else {
        bVar3 = ssl_has_final_version(ssl);
        if (((bVar3) && (uVar4 = ssl_protocol_version(ssl), 0x303 < uVar4)) && (bVar2 != 0x5a)) {
          *out_alert = '2';
          ERR_put_error(0x10,0,0x66,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                        ,0x1d8);
          in_local.size_._4_4_ = ssl_open_record_error;
        }
        else {
          ssl->s3->warning_alert_count = ssl->s3->warning_alert_count + '\x01';
          if (ssl->s3->warning_alert_count < 5) {
            in_local.size_._4_4_ = ssl_open_record_discard;
          }
          else {
            *out_alert = '\n';
            ERR_put_error(0x10,0,0xdc,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                          ,0x1df);
            in_local.size_._4_4_ = ssl_open_record_error;
          }
        }
      }
    }
    else if (uVar1 == '\x02') {
      ERR_put_error(0x10,0,bVar2 + 1000,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,0x1e6);
      ERR_add_error_dataf("SSL alert number %d",(ulong)bVar2);
      *out_alert = '\0';
      in_local.size_._4_4_ = ssl_open_record_error;
    }
    else {
      *out_alert = '/';
      ERR_put_error(0x10,0,0xe3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,0x1ed);
      in_local.size_._4_4_ = ssl_open_record_error;
    }
  }
  else {
    *out_alert = '2';
    ERR_put_error(0x10,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                  ,0x1bd);
    in_local.size_._4_4_ = ssl_open_record_error;
  }
  return in_local.size_._4_4_;
}

Assistant:

enum ssl_open_record_t ssl_process_alert(SSL *ssl, uint8_t *out_alert,
                                         Span<const uint8_t> in) {
  // Alerts records may not contain fragmented or multiple alerts.
  if (in.size() != 2) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_ALERT);
    return ssl_open_record_error;
  }

  ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_ALERT, in);

  const uint8_t alert_level = in[0];
  const uint8_t alert_descr = in[1];

  uint16_t alert = (alert_level << 8) | alert_descr;
  ssl_do_info_callback(ssl, SSL_CB_READ_ALERT, alert);

  if (alert_level == SSL3_AL_WARNING) {
    if (alert_descr == SSL_AD_CLOSE_NOTIFY) {
      ssl->s3->read_shutdown = ssl_shutdown_close_notify;
      return ssl_open_record_close_notify;
    }

    // Warning alerts do not exist in TLS 1.3, but RFC 8446 section 6.1
    // continues to define user_canceled as a signal to cancel the handshake,
    // without specifying how to handle it. JDK11 misuses it to signal
    // full-duplex connection close after the handshake. As a workaround, skip
    // user_canceled as in TLS 1.2. This matches NSS and OpenSSL.
    if (ssl_has_final_version(ssl) &&
        ssl_protocol_version(ssl) >= TLS1_3_VERSION &&
        alert_descr != SSL_AD_USER_CANCELLED) {
      *out_alert = SSL_AD_DECODE_ERROR;
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_ALERT);
      return ssl_open_record_error;
    }

    ssl->s3->warning_alert_count++;
    if (ssl->s3->warning_alert_count > kMaxWarningAlerts) {
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      OPENSSL_PUT_ERROR(SSL, SSL_R_TOO_MANY_WARNING_ALERTS);
      return ssl_open_record_error;
    }
    return ssl_open_record_discard;
  }

  if (alert_level == SSL3_AL_FATAL) {
    OPENSSL_PUT_ERROR(SSL, SSL_AD_REASON_OFFSET + alert_descr);
    ERR_add_error_dataf("SSL alert number %d", alert_descr);
    *out_alert = 0;  // No alert to send back to the peer.
    return ssl_open_record_error;
  }

  *out_alert = SSL_AD_ILLEGAL_PARAMETER;
  OPENSSL_PUT_ERROR(SSL, SSL_R_UNKNOWN_ALERT_TYPE);
  return ssl_open_record_error;
}